

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O3

int linear_expansion_sum_zeroelim(int elen,double *e,int flen,double *f,double *h)

{
  int iVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  bool bVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  
  dVar11 = *e;
  dVar13 = *f;
  bVar9 = dVar11 < dVar13 == dVar13 <= -dVar11;
  if (bVar9) {
    dVar12 = f[1];
    dVar10 = dVar13;
  }
  else {
    dVar10 = dVar11;
    dVar11 = e[1];
    dVar12 = dVar13;
  }
  uVar7 = (ulong)!bVar9;
  uVar4 = (ulong)bVar9;
  uVar5 = (uint)!bVar9;
  if (((int)uVar5 < elen) && ((flen <= (int)(uint)bVar9 || (dVar11 < dVar12 != dVar12 <= -dVar11))))
  {
    dVar13 = dVar11 + dVar10;
    dVar14 = dVar13 - dVar11;
    uVar7 = (ulong)(uVar5 + 1);
    dVar11 = e[uVar7];
  }
  else {
    dVar13 = dVar12 + dVar10;
    dVar14 = dVar13 - dVar12;
    uVar4 = (ulong)(bVar9 + 1);
    dVar12 = f[uVar4];
  }
  dVar10 = dVar10 - dVar14;
  iVar1 = 0;
  if (2 < flen + elen) {
    iVar8 = flen + elen + -2;
    iVar1 = 0;
    dVar14 = dVar13;
    do {
      iVar6 = (int)uVar7;
      iVar3 = (int)uVar4;
      if ((iVar6 < elen) && ((flen <= iVar3 || (dVar11 < dVar12 != dVar12 <= -dVar11)))) {
        dVar15 = dVar10 + dVar11;
        dVar13 = dVar15 - dVar11;
        uVar7 = (ulong)(iVar6 + 1);
        dVar11 = e[(long)iVar6 + 1];
      }
      else {
        dVar15 = dVar10 + dVar12;
        dVar13 = dVar15 - dVar12;
        uVar4 = (ulong)(iVar3 + 1);
        dVar12 = f[(long)iVar3 + 1];
      }
      dVar10 = dVar10 - dVar13;
      if ((dVar10 != 0.0) || (NAN(dVar10))) {
        lVar2 = (long)iVar1;
        iVar1 = iVar1 + 1;
        h[lVar2] = dVar10;
      }
      dVar13 = dVar14 + dVar15;
      dVar10 = (dVar14 - (dVar13 - (dVar13 - dVar14))) + (dVar15 - (dVar13 - dVar14));
      iVar8 = iVar8 + -1;
      dVar14 = dVar13;
    } while (iVar8 != 0);
  }
  if ((dVar10 != 0.0) || (NAN(dVar10))) {
    lVar2 = (long)iVar1;
    iVar1 = iVar1 + 1;
    h[lVar2] = dVar10;
  }
  if (((dVar13 == 0.0) && (!NAN(dVar13))) && (iVar1 != 0)) {
    return iVar1;
  }
  h[iVar1] = dVar13;
  return iVar1 + 1;
}

Assistant:

int linear_expansion_sum_zeroelim(int elen, REAL *e, int flen, REAL *f,
                                  REAL *h)
/* h cannot be e or f. */
{
  REAL Q, q, hh;
  INEXACT REAL Qnew;
  INEXACT REAL R;
  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  int eindex, findex, hindex;
  int count;
  REAL enow, fnow;
  REAL g0;

  enow = e[0];
  fnow = f[0];
  eindex = findex = 0;
  hindex = 0;
  if ((fnow > enow) == (fnow > -enow)) {
    g0 = enow;
    enow = e[++eindex];
  } else {
    g0 = fnow;
    fnow = f[++findex];
  }
  if ((eindex < elen) && ((findex >= flen)
                          || ((fnow > enow) == (fnow > -enow)))) {
    Fast_Two_Sum(enow, g0, Qnew, q);
    enow = e[++eindex];
  } else {
    Fast_Two_Sum(fnow, g0, Qnew, q);
    fnow = f[++findex];
  }
  Q = Qnew;
  for (count = 2; count < elen + flen; count++) {
    if ((eindex < elen) && ((findex >= flen)
                            || ((fnow > enow) == (fnow > -enow)))) {
      Fast_Two_Sum(enow, q, R, hh);
      enow = e[++eindex];
    } else {
      Fast_Two_Sum(fnow, q, R, hh);
      fnow = f[++findex];
    }
    Two_Sum(Q, R, Qnew, q);
    Q = Qnew;
    if (hh != 0) {
      h[hindex++] = hh;
    }
  }
  if (q != 0) {
    h[hindex++] = q;
  }
  if ((Q != 0.0) || (hindex == 0)) {
    h[hindex++] = Q;
  }
  return hindex;
}